

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O1

bool __thiscall
ON_DimStyle::Internal_SetBoolMember(ON_DimStyle *this,field field_id,bool value,bool *class_member)

{
  bool bVar1;
  undefined8 uVar2;
  
  bVar1 = *class_member;
  if (bVar1 != value) {
    *class_member = value;
    ON_ModelComponent::IncrementContentVersionNumber(&this->super_ON_ModelComponent);
    *(undefined4 *)((this->m_content_hash).m_digest + 0x10) =
         ON_SHA1_Hash::EmptyContentHash.m_digest._16_4_;
    uVar2 = ON_SHA1_Hash::EmptyContentHash.m_digest._8_8_;
    *(undefined8 *)(this->m_content_hash).m_digest = ON_SHA1_Hash::EmptyContentHash.m_digest._0_8_;
    *(undefined8 *)((this->m_content_hash).m_digest + 8) = uVar2;
  }
  Internal_SetOverrideDimStyleCandidateFieldOverride(this,field_id);
  return bVar1 != value;
}

Assistant:

bool ON_DimStyle::Internal_SetBoolMember(
  ON_DimStyle::field field_id,
  bool value,
  bool& class_member
)
{
  bool bValueChanged = false;
  const bool b = value ? true : false;
  if (b != class_member)
  {
    class_member = b;
    Internal_ContentChange();
    bValueChanged = true;
  }
  Internal_SetOverrideDimStyleCandidateFieldOverride(field_id);
  return bValueChanged;
}